

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

bool ImNodes::BeginSlot(char *title,int kind)

{
  long lVar1;
  
  lVar1 = *(long *)(gCanvas + 0x98);
  *(char **)(lVar1 + 0x30) = title;
  *(int *)(lVar1 + 0x28) = kind;
  ImGui::BeginGroup();
  return true;
}

Assistant:

bool BeginSlot(const char* title, int kind)
{
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    impl->slot.title = title;
    impl->slot.kind = kind;

    ImGui::BeginGroup();
    return true;
}